

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O1

cTValue * lj_meta_lookup(lua_State *L,cTValue *o,MMS mm)

{
  uint uVar1;
  uint *puVar2;
  cTValue *pcVar3;
  ulong uVar4;
  
  uVar1 = (o->field_2).it;
  if ((uVar1 == 0xfffffff3) || (uVar1 == 0xfffffff4)) {
    puVar2 = (uint *)((ulong)(o->u32).lo + 0x10);
  }
  else {
    uVar4 = 0x23;
    if ((0xfffeffff < uVar1) && (uVar4 = 0x19, (uVar1 & 0xffff8000) != 0xffff0000)) {
      uVar4 = (ulong)(0x15 - uVar1);
    }
    puVar2 = (uint *)((ulong)(L->glref).ptr32 + 0x100 + uVar4 * 4);
  }
  uVar4 = (ulong)*puVar2;
  if (uVar4 != 0) {
    uVar1 = *(uint *)((ulong)(L->glref).ptr32 + 0x100 + (ulong)mm * 4);
    pcVar3 = (cTValue *)
             ((ulong)*(uint *)(uVar4 + 0x14) +
             (ulong)(*(uint *)(uVar4 + 0x1c) & *(uint *)((ulong)uVar1 + 8)) * 0x18);
    do {
      if ((*(int *)((long)pcVar3 + 0xc) == -5) && (pcVar3[1].u32.lo == uVar1)) goto LAB_0010b02f;
      pcVar3 = (cTValue *)(ulong)pcVar3[2].u32.lo;
    } while (pcVar3 != (cTValue *)0x0);
    pcVar3 = (cTValue *)0x0;
LAB_0010b02f:
    if (pcVar3 != (cTValue *)0x0) {
      return pcVar3;
    }
  }
  return (cTValue *)((ulong)(L->glref).ptr32 + 0x68);
}

Assistant:

cTValue *lj_meta_lookup(lua_State *L, cTValue *o, MMS mm)
{
  GCtab *mt;
  if (tvistab(o))
    mt = tabref(tabV(o)->metatable);
  else if (tvisudata(o))
    mt = tabref(udataV(o)->metatable);
  else
    mt = tabref(basemt_obj(G(L), o));
  if (mt) {
    cTValue *mo = lj_tab_getstr(mt, mmname_str(G(L), mm));
    if (mo)
      return mo;
  }
  return niltv(L);
}